

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# deltatimeinfo.cpp
# Opt level: O1

uint64_t __thiscall hbm::streaming::deltaTimeInfo::increment(deltaTimeInfo *this,uint count)

{
  uint64_t uVar1;
  ulong uVar2;
  
  uVar2 = (ulong)count * this->m_deltaSubFraction + this->m_deltaSubFractionCollected;
  this->m_deltaSubFractionCollected = uVar2 & 0xffffffff;
  uVar1 = timeInfo::add(&this->m_time,(uVar2 >> 0x20) + this->m_deltaNtpTimestamp * (ulong)count);
  return uVar1;
}

Assistant:

uint64_t deltaTimeInfo::increment(unsigned int count)
		{
			uint64_t delta = m_deltaNtpTimestamp*count;

			// transfer sub fraction overflow to fractions
			m_deltaSubFractionCollected += m_deltaSubFraction * count;
			delta += (m_deltaSubFractionCollected >> 32) & UINT32_MAX;
			// remove overflow that was added to the fractions
			m_deltaSubFractionCollected &= UINT32_MAX;

			return m_time.add(delta);
		}